

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

int getFD(int adr,int heap)

{
  int iVar1;
  FILE *pFVar2;
  int *piVar3;
  long lVar4;
  
  piVar3 = H;
  if (heap == 0) {
    piVar3 = M;
  }
  iVar1 = piVar3[adr];
  if (iVar1 != 0) {
    lVar4 = 0;
    do {
      tmp[lVar4] = (char)iVar1;
      iVar1 = piVar3[(long)adr + lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (iVar1 != 0);
  }
  fd = fd + 1;
  pFVar2 = fopen(tmp,"r");
  iVar1 = fd;
  fds[fd] = (FILE *)pFVar2;
  return iVar1;
}

Assistant:

int getFD(int adr, int heap) {
	int cnt = 0; int *P = M;
	FILE *cfd;
	if (heap) { P=H;}
	while (P[adr]!=0) { 
		tmp[cnt++]=(char)P[adr];
		adr++;
	}
	fd++;
	cfd = fopen(tmp,"r");
	fds[fd] = cfd;
	return fd;
}